

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O1

int contest(nn_quant *nnq,int al,int b,int g,int r)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (nnq->netsize < 1) {
    uVar3 = 0;
    iVar10 = 0;
  }
  else {
    piVar8 = nnq->network[0] + 3;
    uVar9 = 0;
    dVar11 = 2147483647.0;
    dVar12 = 2147483647.0;
    uVar2 = 0;
    uVar3 = 0;
    do {
      iVar4 = (*(nq_pixel *)(piVar8 + -3))[0] - al;
      iVar10 = -iVar4;
      if (0 < iVar4) {
        iVar10 = iVar4;
      }
      iVar5 = piVar8[-2] - b;
      iVar4 = -iVar5;
      if (0 < iVar5) {
        iVar4 = iVar5;
      }
      iVar6 = piVar8[-1] - g;
      iVar5 = -iVar6;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      iVar7 = *piVar8 - r;
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      iVar10 = iVar6 + iVar5 + iVar4 + iVar10;
      dVar13 = (double)iVar10;
      if (dVar13 < dVar12) {
        uVar3 = uVar9 & 0xffffffff;
      }
      dVar14 = (double)(iVar10 - (nnq->bias[uVar9] >> 0xc));
      if (dVar12 <= dVar13) {
        dVar13 = dVar12;
      }
      dVar12 = dVar13;
      if (dVar14 < dVar11) {
        uVar2 = uVar9 & 0xffffffff;
      }
      iVar10 = (int)uVar2;
      if (dVar11 <= dVar14) {
        dVar14 = dVar11;
      }
      dVar11 = dVar14;
      uVar1 = nnq->freq[uVar9];
      nnq->freq[uVar9] = uVar1 - ((int)uVar1 >> 10);
      nnq->bias[uVar9] = (uVar1 & 0xfffffc00) + nnq->bias[uVar9];
      uVar9 = uVar9 + 1;
      piVar8 = piVar8 + 5;
    } while ((long)uVar9 < (long)nnq->netsize);
  }
  nnq->freq[uVar3] = nnq->freq[uVar3] + 0x40;
  nnq->bias[uVar3] = nnq->bias[uVar3] + -0x10000;
  return iVar10;
}

Assistant:

int contest(nnq, al,b,g,r)
nn_quant *nnq;
register int al,b,g,r;
{
	/* finds closest neuron (min dist) and updates freq */
	/* finds best neuron (min dist-bias) and returns position */
	/* for frequently chosen neurons, freq[i] is high and bias[i] is negative */
	/* bias[i] = gamma*((1/netsize)-freq[i]) */

	register int i,dist,a,biasdist,betafreq;
	unsigned int bestpos,bestbiaspos;
	double bestd,bestbiasd;
	register int *p,*f, *n;

	bestd = ~(((int) 1)<<31);
	bestbiasd = bestd;
	bestpos = 0;
	bestbiaspos = bestpos;
	p = nnq->bias;
	f = nnq->freq;

	for (i=0; i< nnq->netsize; i++) {
		n = nnq->network[i];
		dist = n[0] - al;
		if (dist<0) dist = -dist;
		a = n[1] - b;
		if (a<0) a = -a;
		dist += a;
		a = n[2] - g;
		if (a<0) a = -a;
		dist += a;
		a = n[3] - r;
		if (a<0) a = -a;
		dist += a;
		if (dist<bestd) {
			bestd=dist;
			bestpos=i;
		}
		biasdist = dist - ((*p)>>(intbiasshift-netbiasshift));
		if (biasdist<bestbiasd) {
			bestbiasd=biasdist;
			bestbiaspos=i;
		}
		betafreq = (*f >> betashift);
		*f++ -= betafreq;
		*p++ += (betafreq<<gammashift);
	}
	nnq->freq[bestpos] += beta;
	nnq->bias[bestpos] -= betagamma;
	return(bestbiaspos);
}